

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QOpenFolderButton.h
# Opt level: O0

void __thiscall QOpenFolderButton::~QOpenFolderButton(QOpenFolderButton *this)

{
  void *in_RDI;
  
  ~QOpenFolderButton((QOpenFolderButton *)0x1dac88);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

class QT_WIDGETS_EXTRA_QT_WIDGETS_EXTRA_LIB_EXPORT QOpenFolderButton : public QEmbedableButton {
    Q_OBJECT
    class QOpenFolderButtonPrivate *d;

    Q_PROPERTY(QString filePath READ filePath WRITE setFilePath USER true NOTIFY filePathChanged)
    Q_PROPERTY(QString caption READ caption WRITE setCaption)
    Q_PROPERTY(QString directory READ directory WRITE setDirectory)
    Q_PROPERTY(QFileDialog::Options options READ options WRITE setOptions)

public:
    explicit QOpenFolderButton(QWidget *parent = nullptr);

    QString filePath() const;
    void setFilePath(const QString &filePath);

    QString caption() const;
    void setCaption(const QString &caption);

    QString directory() const;
    void setDirectory(const QString &directory);

    QFileDialog::Options options() const;
    void setOptions(QFileDialog::Options options);

Q_SIGNALS:
    void filePathChanged(const QString &filePath);
}